

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.hpp
# Opt level: O0

void __thiscall
cmdline::parser::add<std::__cxx11::string>
          (parser *this,string *name,char short_name,string *desc,bool need,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *def)

{
  string local_58 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *def_local;
  string *psStack_28;
  bool need_local;
  string *desc_local;
  string *psStack_18;
  char short_name_local;
  string *name_local;
  parser *this_local;
  
  local_38 = def;
  def_local._7_1_ = need;
  psStack_28 = desc;
  desc_local._7_1_ = short_name;
  psStack_18 = name;
  name_local = (string *)this;
  std::__cxx11::string::string(local_58,(string *)def);
  add<std::__cxx11::string,cmdline::default_reader<std::__cxx11::string>>
            (this,name,(int)short_name,desc,need,local_58);
  std::__cxx11::string::~string(local_58);
  return;
}

Assistant:

void add(const std::string &name, char short_name = 0,
           const std::string &desc = "", bool need = true, const T def = T()) {
    add(name, short_name, desc, need, def, default_reader<T>());
  }